

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inlining.cpp
# Opt level: O1

void __thiscall wasm::InlineMainPass::run(InlineMainPass *this,Module *module)

{
  Expression *pEVar1;
  Function *into;
  Function *pFVar2;
  ulong in_RCX;
  undefined1 auVar3 [8];
  Expression **ppEVar4;
  Expression **ppEVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  string_view sVar9;
  InliningAction local_80;
  undefined1 local_70 [8];
  FindAllPointers<wasm::Call> calls;
  
  sVar9 = IString::interned((IString *)0x4,(string_view)ZEXT816(0xb61236),SUB81(in_RCX,0));
  into = Module::getFunctionOrNull(module,(Name)sVar9);
  sVar9 = IString::interned((IString *)0xf,(string_view)ZEXT816(0xb7f86d),SUB81(in_RCX,0));
  pFVar2 = Module::getFunctionOrNull(module,(Name)sVar9);
  if ((((into != (Function *)0x0) && (pFVar2 != (Function *)0x0)) &&
      ((into->super_Importable).module.super_IString.str._M_str == (char *)0x0)) &&
     ((pFVar2->super_Importable).module.super_IString.str._M_str == (char *)0x0)) {
    FindAllPointers<wasm::Call>::FindAllPointers
              ((FindAllPointers<wasm::Call> *)local_70,&into->body);
    calls.list.super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage =
         calls.list.super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
         _M_impl.super__Vector_impl_data._M_start;
    bVar8 = local_70 !=
            (undefined1  [8])
            calls.list.super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
            ._M_impl.super__Vector_impl_data._M_start;
    if (local_70 ==
        (undefined1  [8])
        calls.list.super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      ppEVar4 = (Expression **)0x0;
    }
    else {
      ppEVar4 = (Expression **)0x0;
      auVar3 = local_70;
      do {
        ppEVar5 = *(Expression ***)auVar3;
        pEVar1 = *ppEVar5;
        if (pEVar1->_id != CallId) {
          __assert_fail("int(_id) == int(T::SpecificId)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm.h"
                        ,0x314,"T *wasm::Expression::cast() [T = wasm::Call]");
        }
        sVar9 = IString::interned((IString *)0xf,(string_view)ZEXT816(0xb7f86d),SUB81(in_RCX,0));
        bVar6 = ppEVar4 == (Expression **)0x0;
        if (!bVar6) {
          ppEVar5 = ppEVar4;
        }
        bVar7 = (char *)pEVar1[3].type.id != sVar9._M_str;
        if (!bVar7) {
          ppEVar4 = ppEVar5;
        }
        in_RCX = (ulong)(bVar7 || bVar6);
        if (!bVar7 && !bVar6) break;
        auVar3 = (undefined1  [8])((long)auVar3 + 8);
        bVar8 = auVar3 != (undefined1  [8])
                          calls.list.
                          super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
      } while (bVar8);
    }
    if ((!bVar8) && (ppEVar4 != (Expression **)0x0)) {
      local_80.callSite = ppEVar4;
      local_80.contents = pFVar2;
      anon_unknown_225::doInlining(module,into,&local_80,&((this->super_Pass).runner)->options);
    }
    if (local_70 != (undefined1  [8])0x0) {
      operator_delete((void *)local_70,
                      (long)calls.list.
                            super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)local_70);
    }
  }
  return;
}

Assistant:

void run(Module* module) override {
    auto* main = module->getFunctionOrNull(MAIN);
    auto* originalMain = module->getFunctionOrNull(ORIGINAL_MAIN);
    if (!main || main->imported() || !originalMain ||
        originalMain->imported()) {
      return;
    }
    FindAllPointers<Call> calls(main->body);
    Expression** callSite = nullptr;
    for (auto* call : calls.list) {
      if ((*call)->cast<Call>()->target == ORIGINAL_MAIN) {
        if (callSite) {
          // More than one call site.
          return;
        }
        callSite = call;
      }
    }
    if (!callSite) {
      // No call at all.
      return;
    }
    doInlining(
      module, main, InliningAction(callSite, originalMain), getPassOptions());
  }